

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Builder::Apply(Builder *this,VersionEdit *edit)

{
  _Rb_tree_header *p_Var1;
  undefined4 *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  pointer ppVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  long lVar13;
  pointer ppVar14;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar15;
  uint64_t number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar10 = (edit->compact_pointers_).
            super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((edit->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar10) {
    lVar13 = 0x10;
    uVar12 = 0;
    do {
      lVar4 = *(long *)((long)&ppVar10->first + lVar13);
      if (lVar4 == 0) {
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x96,"Slice leveldb::InternalKey::Encode() const");
      }
      iVar3 = *(int *)((long)ppVar10 + lVar13 + -0x10);
      lVar5 = *(long *)((long)ppVar10 + lVar13 + -8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,lVar5,lVar4 + lVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this->vset_->compact_pointer_ + iVar3,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar12 = uVar12 + 1;
      ppVar10 = (edit->compact_pointers_).
                super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x28;
    } while (uVar12 < (ulong)(((long)(edit->compact_pointers_).
                                     super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 3
                              ) * -0x3333333333333333));
  }
  p_Var11 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    do {
      local_58._M_dataplus._M_p = (pointer)p_Var11[1]._M_parent;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(this->levels_ + (int)p_Var11[1]._M_color),(unsigned_long *)&local_58);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  ppVar14 = (edit->new_files_).
            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((edit->new_files_).
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar14) {
    lVar13 = 0x48;
    uVar12 = 0;
    do {
      iVar3 = *(int *)((long)ppVar14 + lVar13 + -0x48);
      p_Var11 = (_Base_ptr)operator_new(0x58);
      puVar2 = (undefined4 *)((long)ppVar14 + lVar13 + -0x40);
      uVar6 = puVar2[1];
      uVar7 = puVar2[2];
      uVar8 = puVar2[3];
      *(undefined4 *)&p_Var11->_M_color = *puVar2;
      *(undefined4 *)&p_Var11->field_0x4 = uVar6;
      *(undefined4 *)&p_Var11->_M_parent = uVar7;
      *(undefined4 *)((long)&p_Var11->_M_parent + 4) = uVar8;
      p_Var11->_M_left = *(_Base_ptr *)((long)ppVar14 + lVar13 + -0x30);
      p_Var11->_M_right = (_Base_ptr)&p_Var11[1]._M_parent;
      lVar4 = *(long *)((long)ppVar14 + lVar13 + -0x28);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var11->_M_right,lVar4,
                 *(long *)((long)ppVar14 + lVar13 + -0x20) + lVar4);
      p_Var11[1]._M_right = (_Base_ptr)&p_Var11[2]._M_parent;
      lVar4 = *(long *)((long)ppVar14 + lVar13 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var11[1]._M_right,lVar4,
                 *(long *)((long)&ppVar14->first + lVar13) + lVar4);
      *(undefined4 *)&p_Var11->_M_color = 1;
      iVar9 = (int)((ulong)p_Var11->_M_left >> 0xe);
      if (iVar9 < 0x65) {
        iVar9 = 100;
      }
      *(int *)&p_Var11->field_0x4 = iVar9;
      local_58._M_dataplus._M_p = (pointer)p_Var11;
      pVar15 = std::
               _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)(this->levels_ + iVar3),(key_type *)&p_Var11->_M_parent);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)(this->levels_ + iVar3),(_Base_ptr)pVar15.first._M_node,
                     (_Base_ptr)pVar15.second._M_node);
      std::
      _Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
      ::_M_insert_unique<leveldb::FileMetaData*const&>
                ((_Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
                  *)this->levels_[iVar3].added_files,(FileMetaData **)&local_58);
      uVar12 = uVar12 + 1;
      ppVar14 = (edit->new_files_).
                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x60;
    } while (uVar12 < (ulong)(((long)(edit->new_files_).
                                     super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar14 >> 5
                              ) * -0x5555555555555555));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Apply(VersionEdit* edit) {
    // Update compaction pointers
    for (size_t i = 0; i < edit->compact_pointers_.size(); i++) {
      const int level = edit->compact_pointers_[i].first;
      vset_->compact_pointer_[level] =
          edit->compact_pointers_[i].second.Encode().ToString();
    }

    // Delete files
    for (const auto& deleted_file_set_kvp : edit->deleted_files_) {
      const int level = deleted_file_set_kvp.first;
      const uint64_t number = deleted_file_set_kvp.second;
      levels_[level].deleted_files.insert(number);
    }

    // Add new files
    for (size_t i = 0; i < edit->new_files_.size(); i++) {
      const int level = edit->new_files_[i].first;
      FileMetaData* f = new FileMetaData(edit->new_files_[i].second);
      f->refs = 1;

      // We arrange to automatically compact this file after
      // a certain number of seeks.  Let's assume:
      //   (1) One seek costs 10ms
      //   (2) Writing or reading 1MB costs 10ms (100MB/s)
      //   (3) A compaction of 1MB does 25MB of IO:
      //         1MB read from this level
      //         10-12MB read from next level (boundaries may be misaligned)
      //         10-12MB written to next level
      // This implies that 25 seeks cost the same as the compaction
      // of 1MB of data.  I.e., one seek costs approximately the
      // same as the compaction of 40KB of data.  We are a little
      // conservative and allow approximately one seek for every 16KB
      // of data before triggering a compaction.
      f->allowed_seeks = static_cast<int>((f->file_size / 16384U));
      if (f->allowed_seeks < 100) f->allowed_seeks = 100;

      levels_[level].deleted_files.erase(f->number);
      levels_[level].added_files->insert(f);
    }
  }